

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

void pstore::command_line::
     apply_to_option<pstore::command_line::alias&,char_const(&)[2],pstore::command_line::desc_const&,pstore::command_line::aliasopt_const&>
               (alias *opt,char (*m0) [2],desc *mods,aliasopt *mods_1)

{
  string local_40;
  
  make_modifier((name *)&local_40,*m0);
  option::set_name(&opt->super_option,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  apply_to_option<pstore::command_line::alias&,pstore::command_line::desc_const&,pstore::command_line::aliasopt_const&>
            (opt,mods,mods_1);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }